

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int frame_pack_headers_shared(nghttp2_bufs *bufs,nghttp2_frame_hd *frame_hd)

{
  nghttp2_buf_chain *pnVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  uint8_t *puVar3;
  nghttp2_buf_chain *pnVar4;
  nghttp2_frame_hd local_28;
  
  pnVar4 = bufs->head;
  local_28.stream_id = frame_hd->stream_id;
  local_28.type = frame_hd->type;
  local_28.flags = frame_hd->flags;
  local_28.reserved = frame_hd->reserved;
  local_28._15_1_ = frame_hd->field_0xf;
  puVar3 = (pnVar4->buf).pos;
  local_28.length = (long)(pnVar4->buf).last - (long)puVar3;
  if (pnVar4 != bufs->cur) {
    local_28._8_8_ = local_28._8_8_ & 0xfffffbffffffffff;
  }
  puVar3 = puVar3 + -9;
  (pnVar4->buf).pos = puVar3;
  nghttp2_frame_pack_frame_hd(puVar3,&local_28);
  pnVar4 = bufs->head;
  pnVar1 = bufs->cur;
  iVar2 = extraout_EAX;
  if (pnVar4 != pnVar1) {
    local_28._12_2_ = 9;
    while( true ) {
      pnVar4 = pnVar4->next;
      puVar3 = (pnVar4->buf).pos;
      local_28.length = (long)(pnVar4->buf).last - (long)puVar3;
      if (pnVar4 == pnVar1) break;
      (pnVar4->buf).pos = puVar3 + -9;
      nghttp2_frame_pack_frame_hd(puVar3 + -9,&local_28);
    }
    local_28.flags = '\x04';
    (pnVar4->buf).pos = puVar3 + -9;
    nghttp2_frame_pack_frame_hd(puVar3 + -9,&local_28);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

static int frame_pack_headers_shared(nghttp2_bufs *bufs,
                                     nghttp2_frame_hd *frame_hd) {
  nghttp2_buf *buf;
  nghttp2_buf_chain *ci, *ce;
  nghttp2_frame_hd hd;

  buf = &bufs->head->buf;

  hd = *frame_hd;
  hd.length = nghttp2_buf_len(buf);

  DEBUGF("send: HEADERS/PUSH_PROMISE, payloadlen=%zu\n", hd.length);

  /* We have multiple frame buffers, which means one or more
     CONTINUATION frame is involved. Remove END_HEADERS flag from the
     first frame. */
  if (bufs->head != bufs->cur) {
    hd.flags = (uint8_t)(hd.flags & ~NGHTTP2_FLAG_END_HEADERS);
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;
  nghttp2_frame_pack_frame_hd(buf->pos, &hd);

  if (bufs->head != bufs->cur) {
    /* 2nd and later frames are CONTINUATION frames. */
    hd.type = NGHTTP2_CONTINUATION;
    /* We don't have no flags except for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_NONE;

    ce = bufs->cur;

    for (ci = bufs->head->next; ci != ce; ci = ci->next) {
      buf = &ci->buf;

      hd.length = nghttp2_buf_len(buf);

      DEBUGF("send: int CONTINUATION, payloadlen=%zu\n", hd.length);

      buf->pos -= NGHTTP2_FRAME_HDLEN;
      nghttp2_frame_pack_frame_hd(buf->pos, &hd);
    }

    buf = &ci->buf;
    hd.length = nghttp2_buf_len(buf);
    /* Set END_HEADERS flag for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_END_HEADERS;

    DEBUGF("send: last CONTINUATION, payloadlen=%zu\n", hd.length);

    buf->pos -= NGHTTP2_FRAME_HDLEN;
    nghttp2_frame_pack_frame_hd(buf->pos, &hd);
  }

  return 0;
}